

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  bool bVar1;
  int iVar2;
  Token *pTVar3;
  byte local_3b9;
  AlphaNum local_360;
  AlphaNum local_330;
  undefined1 local_300 [40];
  char *local_2d8;
  undefined1 local_2d0 [8];
  string text_1;
  AlphaNum local_280;
  undefined1 local_250 [48];
  undefined1 local_220 [8];
  string text;
  string local_1f8;
  byte local_1d2;
  allocator<char> local_1d1;
  undefined1 local_1d0 [6];
  bool has_minus;
  allocator<char> local_1a9;
  string local_1a8;
  byte local_183;
  byte local_182;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined1 local_48 [48];
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  iVar2 = this->recursion_limit_ + -1;
  this->recursion_limit_ = iVar2;
  local_18 = this;
  if (iVar2 < 0) {
    absl::lts_20240722::AlphaNum::AlphaNum
              (&local_78,
               "Message is too deep, the parser exceeded the configured recursion limit of ");
    absl::lts_20240722::AlphaNum::AlphaNum(&local_a8,this->initial_recursion_limit_);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,".");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_48,&local_78,&local_a8);
    local_48._32_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    ReportError(this,(string_view)local_48._32_16_);
    std::__cxx11::string::~string((string *)local_48);
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = LookingAtType(this,TYPE_STRING);
    if (bVar1) {
      while (bVar1 = LookingAtType(this,TYPE_STRING), bVar1) {
        io::Tokenizer::Next(&this->tokenizer_);
      }
      this->recursion_limit_ = this->recursion_limit_ + 1;
      this_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"[",&local_109);
      bVar1 = TryConsume(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"]",&local_131);
        bVar1 = TryConsume(this,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0056c5dc:
          this->recursion_limit_ = this->recursion_limit_ + 1;
          this_local._7_1_ = 1;
        }
        else {
          do {
            std::allocator<char>::allocator();
            local_182 = 0;
            local_183 = 0;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"{",&local_159);
            bVar1 = LookingAt(this,&local_158);
            local_3b9 = 0;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_182 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_180,"<",&local_181);
              local_183 = 1;
              bVar1 = LookingAt(this,&local_180);
              local_3b9 = bVar1 ^ 0xff;
            }
            if ((local_183 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_180);
            }
            if ((local_182 & 1) != 0) {
              std::allocator<char>::~allocator(&local_181);
            }
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator(&local_159);
            if ((local_3b9 & 1) == 0) {
              bVar1 = SkipFieldMessage(this);
              if (!bVar1) {
                this_local._7_1_ = 0;
                goto LAB_0056ca2f;
              }
            }
            else {
              bVar1 = SkipFieldValue(this);
              if (!bVar1) {
                this_local._7_1_ = 0;
                goto LAB_0056ca2f;
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"]",&local_1a9);
            bVar1 = TryConsume(this,&local_1a8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::allocator<char>::~allocator(&local_1a9);
            if (bVar1) goto LAB_0056c5dc;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)local_1d0,",",&local_1d1);
            bVar1 = Consume(this,(string *)local_1d0);
            std::__cxx11::string::~string((string *)local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
          } while (bVar1);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"-",(allocator<char> *)(text.field_2._M_local_buf + 0xf));
        bVar1 = TryConsume(this,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)(text.field_2._M_local_buf + 0xf));
        local_1d2 = bVar1;
        bVar1 = LookingAtType(this,TYPE_INTEGER);
        if (((bVar1) || (bVar1 = LookingAtType(this,TYPE_FLOAT), bVar1)) ||
           (bVar1 = LookingAtType(this,TYPE_IDENTIFIER), bVar1)) {
          if ((local_1d2 & 1) != 0) {
            bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
            if (bVar1) {
              pTVar3 = io::Tokenizer::current(&this->tokenizer_);
              std::__cxx11::string::string((string *)local_2d0,(string *)&pTVar3->text);
              absl::lts_20240722::AsciiStrToLower((string *)local_2d0);
              bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2d0,"inf");
              if (((bVar1) &&
                  (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_2d0,"infinity"), bVar1)) &&
                 (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_2d0,"nan"), bVar1)) {
                absl::lts_20240722::AlphaNum::AlphaNum(&local_330,"Invalid float number: ");
                absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                          (&local_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2d0);
                absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_300,&local_330);
                join_0x00000010_0x00000000_ =
                     (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_300);
                ReportError(this,join_0x00000010_0x00000000_);
                std::__cxx11::string::~string((string *)local_300);
                this->recursion_limit_ = this->recursion_limit_ + 1;
                this_local._7_1_ = 0;
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
              std::__cxx11::string::~string((string *)local_2d0);
              if (bVar1) goto LAB_0056ca2f;
            }
          }
          io::Tokenizer::Next(&this->tokenizer_);
          this->recursion_limit_ = this->recursion_limit_ + 1;
          this_local._7_1_ = 1;
        }
        else {
          pTVar3 = io::Tokenizer::current(&this->tokenizer_);
          std::__cxx11::string::string((string *)local_220,(string *)&pTVar3->text);
          absl::lts_20240722::AlphaNum::AlphaNum
                    (&local_280,"Cannot skip field value, unexpected token: ");
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                    ((AlphaNum *)((long)&text_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220)
          ;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_250,&local_280);
          local_250._32_16_ =
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_250);
          ReportError(this,(string_view)local_250._32_16_);
          std::__cxx11::string::~string((string *)local_250);
          this->recursion_limit_ = this->recursion_limit_ + 1;
          this_local._7_1_ = 0;
          std::__cxx11::string::~string((string *)local_220);
        }
      }
    }
  }
LAB_0056ca2f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      if (!TryConsume("]")) {
        while (true) {
          if (!LookingAt("{") && !LookingAt("<")) {
            DO(SkipFieldValue());
          } else {
            DO(SkipFieldMessage());
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError(
          absl::StrCat("Cannot skip field value, unexpected token: ", text));
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError(absl::StrCat("Invalid float number: ", text));
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }